

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dksh.cpp
# Opt level: O1

void __thiscall
context::write_dksh(context *this,size_t code_size,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *output)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  program_type pVar4;
  int iVar5;
  undefined1 uVar6;
  uint uVar7;
  char *fmt;
  uint uVar8;
  optional<long> oVar9;
  string_view label;
  array<unsigned_long,_32UL> result;
  uint local_174;
  int local_170;
  undefined4 local_16c;
  undefined8 local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  int local_110;
  undefined8 local_10c;
  int local_104;
  undefined1 local_100;
  undefined1 local_ff;
  undefined1 local_fe;
  undefined1 local_fd;
  undefined8 local_fc;
  uint local_f4;
  uint local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  int local_e4;
  undefined8 local_e0;
  
  if ((this->type).super__Optional_base<context::program_type,_true,_true>._M_payload.
      super__Optional_payload_base<context::program_type>._M_engaged == false) {
    fmt = 
    "no type provided, valid are types: vertex, tess_control, tess_eval, geometry, fragment, compute"
    ;
  }
  else {
    std::optional<std::__cxx11::string>::value_or<char_const(&)[5]>
              (&local_130,&this->entrypoint,(char (*) [5])0x132328);
    label._M_len._4_4_ = local_130._M_string_length._4_4_;
    label._M_len._0_4_ = (undefined4)local_130._M_string_length;
    label._M_str = local_130._M_dataplus._M_p;
    oVar9 = find_label(this,label);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (((undefined1  [16])
         oVar9.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::optional<std::__cxx11::string>::value_or<char_const(&)[5]>
                (&local_130,&this->entrypoint,(char (*) [5])0x132328);
      fatal_error("entrypoint \"%s\" not found",local_130._M_dataplus._M_p);
    }
    if ((oVar9.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload & 0x800000000000001fU) == 8) {
      uVar7 = this->local_mem_size + 0xfU & 0xfffffff0;
      pVar4 = (this->type).super__Optional_base<context::program_type,_true,_true>._M_payload.
              super__Optional_payload_base<context::program_type>._M_payload._M_value;
      iVar5 = this->num_gprs;
      if (pVar4 == compute) {
        uVar6 = (undefined1)(this->block_dimensions)._M_elems[0];
        uVar1 = *(undefined1 *)((long)(this->block_dimensions)._M_elems + 1);
        uVar2 = *(undefined1 *)((long)(this->block_dimensions)._M_elems + 2);
        uVar3 = *(undefined1 *)((long)(this->block_dimensions)._M_elems + 3);
        local_160 = *(undefined8 *)((this->block_dimensions)._M_elems + 1);
        uVar8 = this->shared_mem_size + 0xffU & 0xffffff00;
        local_170 = this->num_barriers;
        local_16c = 0x800;
        local_174 = uVar7;
      }
      else {
        if (pVar4 == fragment) {
          uVar1 = this->early_fragment_tests;
          uVar2 = this->post_depth_coverage;
          uVar3 = this->persample_invocation;
        }
        else {
          if ((pVar4 == vertex) &&
             (((this->second_entrypoint).
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_engaged != false || (this->second_num_gprs != 0)))) {
            fmt = "dual vertex shaders are not implemented";
            goto LAB_0012e69d;
          }
          uVar1 = 0;
          uVar2 = 0;
          uVar3 = 0;
        }
        local_160 = 0;
        uVar8 = 0;
        local_174 = 0;
        local_16c = 0;
        local_170 = 0;
        uVar6 = 0;
      }
      memset(&local_130,0,0x100);
      local_130._M_dataplus._M_p = (pointer)0x1848534b44;
      local_130._M_string_length._0_4_ = 0x100;
      local_130.field_2._M_allocated_capacity = 0x100000018;
      local_10c = 0;
      local_fc = local_160;
      local_f0 = local_174;
      local_ec = 0;
      local_e8 = local_16c;
      local_e4 = local_170;
      local_e0 = 0;
      local_130._M_string_length._4_4_ = (int)code_size * 8 + 0xffU & 0xffffff00;
      local_130.field_2._8_4_ = pVar4;
      local_130.field_2._12_4_ =
           oVar9.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload._0_4_ + -8;
      local_110 = iVar5;
      local_104 = uVar7 * 0x20 + 0x800;
      local_100 = uVar6;
      local_ff = uVar1;
      local_fe = uVar2;
      local_fd = uVar3;
      local_f4 = uVar8;
      std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_range_insert<unsigned_long*>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)output,
                 (output->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish,&local_130,&stack0xffffffffffffffd0);
      return;
    }
    fmt = "entrypoint is not aligned";
  }
LAB_0012e69d:
  fatal_error(fmt);
}

Assistant:

void context::write_dksh(size_t code_size, std::vector<uint64_t>& output) const
{
    if (!type) {
        fatal_error(
            "no type provided, "
            "valid are types: vertex, tess_control, tess_eval, geometry, fragment, compute");
    }
    const std::optional entrypoint_code_offset = find_label(entrypoint.value_or("main"));
    if (!entrypoint_code_offset) {
        fatal_error("entrypoint \"%s\" not found", entrypoint.value_or("main").c_str());
    }
    if (*entrypoint_code_offset % 32 != 8) {
        fatal_error("entrypoint is not aligned");
    }

    const int local_pos_sz = align8(local_mem_size);
    const int local_neg_sz = 0;
    const int crs_sz = 0x800;

    dksh_program_header program_header;
    std::memset(&program_header, 0, sizeof(program_header));
    program_header.type = static_cast<uint32_t>(*type);
    program_header.entrypoint = *entrypoint_code_offset - 8;
    program_header.num_gprs = num_gprs;
    program_header.constbuf1_off = 0; // TODO
    program_header.constbuf1_sz = 0;
    program_header.per_warp_scratch_sz = (local_pos_sz + local_neg_sz) * 32 + crs_sz;
    switch (*type) {
    case program_type::vertex:
        if (second_entrypoint || second_num_gprs) {
            fatal_error("dual vertex shaders are not implemented");
        }
        break;
    case program_type::fragment:
        program_header.frag.early_fragment_tests = early_fragment_tests;
        program_header.frag.post_depth_coverage = post_depth_coverage;
        program_header.frag.persample_invocation = persample_invocation;
        break;
    case program_type::compute:
        program_header.comp.block_dims = block_dimensions;
        program_header.comp.shared_mem_sz = align256(shared_mem_size);
        program_header.comp.local_pos_mem_sz = local_pos_sz;
        program_header.comp.local_neg_mem_sz = local_neg_sz;
        program_header.comp.crs_sz = crs_sz;
        program_header.comp.num_barriers = num_barriers;
        break;
    default:
        break;
    }
    static constexpr size_t dksh_size = sizeof(dksh_header) + sizeof(dksh_program_header);
    dksh_header header;
    header.magic = DKSH_MAGIC;
    header.header_sz = sizeof(dksh_header);
    header.control_sz = align256(dksh_size);
    header.code_sz = align256(code_size * sizeof(uint64_t));
    header.programs_off = sizeof(dksh_header);
    header.num_programs = 1;

    std::array<uint64_t, align256(dksh_size) / sizeof(uint64_t)> result{};
    char* const result_bytes = reinterpret_cast<char*>(result.data());
    std::memcpy(result_bytes, &header, sizeof(header));
    std::memcpy(result_bytes + sizeof(header), &program_header, sizeof(program_header));
    output.insert(output.end(), result.begin(), result.end());
}